

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtShapeHull.cpp
# Opt level: O2

void __thiscall cbtShapeHull::~cbtShapeHull(cbtShapeHull *this)

{
  cbtAlignedObjectArray<unsigned_int>::clear(&this->m_indices);
  cbtAlignedObjectArray<cbtVector3>::clear(&this->m_vertices);
  cbtAlignedObjectArray<unsigned_int>::~cbtAlignedObjectArray(&this->m_indices);
  cbtAlignedObjectArray<cbtVector3>::~cbtAlignedObjectArray(&this->m_vertices);
  return;
}

Assistant:

cbtShapeHull::~cbtShapeHull()
{
	m_indices.clear();
	m_vertices.clear();
}